

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetConstantFromInst
          (ConstantManager *this,Instruction *inst)

{
  uint **ppuVar1;
  uint *__first;
  pointer __position;
  uint32_t uVar2;
  Operand *pOVar3;
  uint **ppuVar4;
  const_iterator __last;
  ulong uVar5;
  Type *type;
  Constant *pCVar6;
  uint32_t i;
  uint32_t index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literal_words_or_ids;
  uint local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index = 0;
  while( true ) {
    uVar2 = Instruction::NumInOperands(inst);
    __position = local_48._M_impl.super__Vector_impl_data._M_finish;
    if (uVar2 <= index) break;
    pOVar3 = Instruction::GetInOperand(inst,index);
    ppuVar1 = (uint **)(pOVar3->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar4 = &(pOVar3->words).small_data_;
    if (ppuVar1 != (uint **)0x0) {
      ppuVar4 = ppuVar1;
    }
    __first = *ppuVar4;
    pOVar3 = Instruction::GetInOperand(inst,index);
    __last = utils::SmallVector<unsigned_int,_2UL>::end(&pOVar3->words);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int_const*,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,
               (const_iterator)__position,__first,__last);
    index = index + 1;
  }
  uVar5 = (ulong)inst->opcode_;
  pCVar6 = (Constant *)0x0;
  if (uVar5 < 0x34) {
    if ((0x8580000000000U >> (uVar5 & 0x3f) & 1) == 0) {
      if (uVar5 == 0x29) {
        local_4c = 1;
      }
      else {
        if (uVar5 != 0x2a) goto LAB_00499dac;
        local_4c = 0;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_4c);
    }
    type = GetType(this,inst);
    pCVar6 = GetConstant(this,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48)
    ;
  }
LAB_00499dac:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return pCVar6;
}

Assistant:

const Constant* ConstantManager::GetConstantFromInst(const Instruction* inst) {
  std::vector<uint32_t> literal_words_or_ids;

  // Collect the constant defining literals or component ids.
  for (uint32_t i = 0; i < inst->NumInOperands(); i++) {
    literal_words_or_ids.insert(literal_words_or_ids.end(),
                                inst->GetInOperand(i).words.begin(),
                                inst->GetInOperand(i).words.end());
  }

  switch (inst->opcode()) {
    // OpConstant{True|False} have the value embedded in the opcode. So they
    // are not handled by the for-loop above. Here we add the value explicitly.
    case spv::Op::OpConstantTrue:
      literal_words_or_ids.push_back(true);
      break;
    case spv::Op::OpConstantFalse:
      literal_words_or_ids.push_back(false);
      break;
    case spv::Op::OpConstantNull:
    case spv::Op::OpConstant:
    case spv::Op::OpConstantComposite:
    case spv::Op::OpSpecConstantComposite:
      break;
    default:
      return nullptr;
  }

  return GetConstant(GetType(inst), literal_words_or_ids);
}